

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O2

reentrant_put_transaction<void> *
density_tests::detail::
PutTestObject<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>,_128UL,_8UL>
::reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
               conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
               *i_queue,EasyRandom *param_2)

{
  reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_> transaction;
  reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_> local_d8;
  reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_> local_b8;
  TestObject<128UL,_8UL> local_98;
  
  TestObject<128UL,_8UL>::TestObject(&local_98);
  density::
  lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>
  ::start_reentrant_push<density_tests::TestObject<128ul,8ul>>
            (&local_b8,
             (lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>
              *)i_queue,&local_98);
  local_d8.m_put.m_user_storage = local_b8.m_put.m_user_storage;
  local_d8.m_put.m_control_block = local_b8.m_put.m_control_block;
  local_d8.m_put.m_next_ptr = local_b8.m_put.m_next_ptr;
  local_d8.m_queue = local_b8.m_queue;
  local_b8.m_put.m_user_storage = (void *)0x0;
  density::
  lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_>::~reentrant_put_transaction
            (&local_b8);
  TestObject<128UL,_8UL>::~TestObject(&local_98);
  exception_checkpoint();
  (__return_storage_ptr__->m_put).m_user_storage = local_d8.m_put.m_user_storage;
  (__return_storage_ptr__->m_put).m_control_block = local_d8.m_put.m_control_block;
  (__return_storage_ptr__->m_put).m_next_ptr = local_d8.m_put.m_next_ptr;
  __return_storage_ptr__->m_queue = local_b8.m_queue;
  local_d8.m_put.m_user_storage = (void *)0x0;
  density::
  lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_>::~reentrant_put_transaction
            (&local_d8);
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & i_queue, EasyRandom &)
            {
                auto transaction = i_queue.start_reentrant_push(ElementType());
                exception_checkpoint();
                return std::move(transaction);
            }